

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slider.cpp
# Opt level: O2

Component ftxui::Slider<int>(ConstStringRef *label,int *value,int min,int max,int increment)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  undefined4 in_register_00000014;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Component CVar2;
  int local_30;
  int local_2c;
  _Alloc_hider local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  int local_18 [2];
  
  local_18 = (int  [2])CONCAT44(in_register_00000014,min);
  local_30 = increment;
  local_2c = max;
  std::make_shared<ftxui::SliderBase<int>,ftxui::ConstStringRef&,int*&,int&,int&,int&>
            ((ConstStringRef *)&local_28,(int **)value,local_18,&local_2c,&local_30);
  _Var1._M_pi = _Stack_20._M_pi;
  _Stack_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (label->owned_)._M_dataplus._M_p = local_28._M_p;
  (label->owned_)._M_string_length = (size_type)_Var1._M_pi;
  local_28._M_p = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_20);
  CVar2.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  CVar2.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)label;
  return (Component)CVar2.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Component Slider(ConstStringRef label, T* value, T min, T max, T increment) {
  return Make<SliderBase<T>>(std::move(label), value, min, max, increment);
}